

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmers.h
# Opt level: O2

void __thiscall Kmers<DNA>::ForEach(Kmers<DNA> *this,Callback *block)

{
  ulong __args_1;
  pointer pcVar1;
  size_type sVar2;
  size_t sVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t k;
  ulong uVar10;
  
  pcVar1 = (this->mRef->sequence)._M_dataplus._M_p;
  bVar5 = 0;
  uVar6 = 0;
  uVar9 = 0xffffffffffffffff;
  for (uVar10 = 0; uVar10 < this->mLength; uVar10 = uVar10 + 1) {
    bVar4 = BitMapPolicy<DNA>::BitMap(pcVar1[uVar10]);
    uVar8 = uVar10;
    if (-1 < (char)bVar4) {
      uVar6 = uVar6 | (uint)bVar4 << (bVar5 & 0x1e);
      uVar8 = uVar9;
    }
    bVar5 = bVar5 + 2;
    uVar9 = uVar8;
  }
  uVar7 = 0xffffffff;
  if (uVar9 == 0xffffffffffffffff) {
    uVar7 = uVar6;
  }
  std::function<void_(unsigned_int,_unsigned_long)>::operator()(block,uVar7,0);
  sVar2 = (this->mRef->sequence)._M_string_length;
  sVar3 = this->mLength;
  uVar8 = 0;
  while (__args_1 = uVar8 + 1, __args_1 <= sVar2 - sVar3) {
    uVar6 = uVar6 >> 2;
    bVar5 = BitMapPolicy<DNA>::BitMap(pcVar1[uVar10 + uVar8]);
    if ((char)bVar5 < '\0') {
      uVar9 = uVar8 + this->mLength;
    }
    else {
      uVar6 = uVar6 | (uint)bVar5 << ((char)(int)this->mLength * '\x02' + 0x1eU & 0x1f);
    }
    uVar7 = 0xffffffff;
    if (uVar9 < __args_1) {
      uVar7 = uVar6;
    }
    if (uVar9 == 0xffffffffffffffff) {
      uVar7 = uVar6;
    }
    std::function<void_(unsigned_int,_unsigned_long)>::operator()(block,uVar7,__args_1);
    uVar8 = __args_1;
  }
  return;
}

Assistant:

void ForEach( const Callback& block ) const {
    const char* ptr = mRef.sequence.data();

    auto bitIndex = []( const size_t pos ) {
      return ( pos * BitMapPolicy< Alphabet >::NumBits ) % ( sizeof( Kmer ) * 8 );
    };

    auto bitMapNucleotide = []( const char base ) {
      return BitMapPolicy< Alphabet >::BitMap( base );
    };

    // First kmer
    size_t lastAmbigIndex = ( size_t ) -1;
    Kmer   kmer           = 0;
    for( size_t k = 0; k < mLength; k++ ) {
      int8_t val = bitMapNucleotide( *ptr );
      if( val < 0 ) {
        lastAmbigIndex = k;
      } else {
        kmer |= ( val << bitIndex( k ) );
      }
      ptr++;
    }

    if( lastAmbigIndex == ( size_t ) -1 ) {
      block( kmer, 0 );
    } else {
      block( AmbiguousKmer, 0 );
    }

    // For each consecutive kmer, shift window by one
    size_t maxFrame = mRef.Length() - mLength;
    for( size_t frame = 1; frame <= maxFrame; frame++, ptr++ ) {
      kmer >>= BitMapPolicy< Alphabet >::NumBits;
      int8_t val = bitMapNucleotide( *ptr );
      if( val < 0 ) {
        lastAmbigIndex = frame + mLength - 1;
      } else {
        kmer |= ( val << bitIndex( mLength - 1 ) );
      }

      if( lastAmbigIndex == ( size_t ) -1 || frame > lastAmbigIndex ) {
        block( kmer, frame );
      } else {
        block( AmbiguousKmer, frame );
      }
    }
  }